

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

string * __thiscall
CLI::Option::help_positional_abi_cxx11_(string *__return_storage_ptr__,Option *this)

{
  int iVar1;
  bool local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  Option *local_18;
  Option *this_local;
  string *out;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Option *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->pname_);
  iVar1 = get_expected(this);
  if (iVar1 < 2) {
    iVar1 = get_expected(this);
    if (iVar1 == -1) {
      ::std::operator+(&local_d0,__return_storage_ptr__,"...");
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
      ::std::__cxx11::string::~string((string *)&local_d0);
    }
  }
  else {
    ::std::operator+(&local_80,__return_storage_ptr__,"(");
    iVar1 = get_expected(this);
    std::__cxx11::to_string(&local_b0,iVar1);
    ::std::operator+(&local_60,&local_80,&local_b0);
    ::std::operator+(&local_40,&local_60,"x)");
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_80);
  }
  local_111 = OptionBase<CLI::Option>::get_required(&this->super_OptionBase<CLI::Option>);
  if (local_111) {
    ::std::__cxx11::string::string((string *)&local_f0,(string *)__return_storage_ptr__);
  }
  else {
    ::std::operator+(&local_110,"[",__return_storage_ptr__);
    ::std::operator+(&local_f0,&local_110,"]");
  }
  local_111 = !local_111;
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  if (local_111) {
    ::std::__cxx11::string::~string((string *)&local_110);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string help_positional() const {
        std::string out = pname_;
        if(get_expected() > 1)
            out = out + "(" + std::to_string(get_expected()) + "x)";
        else if(get_expected() == -1)
            out = out + "...";
        out = get_required() ? out : "[" + out + "]";
        return out;
    }